

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

uint32_t __thiscall
asmjit::v1_14::RALocalAllocator::decideOnReassignment
          (RALocalAllocator *this,RegGroup group,uint32_t workId,uint32_t physId,
          RegMask allocableRegs,RAInst *raInst)

{
  uint **ppuVar1;
  uint **ppuVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  WorkToPhysMap *pWVar7;
  BaseCompiler *pBVar8;
  uint32_t uVar9;
  PhysToWorkMap *pPVar10;
  PhysToWorkMap *pPVar11;
  uint *puVar12;
  uint *puVar13;
  uint uVar14;
  RegGroup RVar15;
  uint uVar16;
  uint uVar17;
  Error EVar18;
  RABlock *pRVar19;
  uint uVar20;
  ulong uVar21;
  RABlock *block;
  uint uVar22;
  ulong unaff_RBX;
  long lVar23;
  undefined7 in_register_00000031;
  BaseNode *pBVar24;
  uint32_t *puVar25;
  InstNode *node;
  RALocalAllocator *this_00;
  undefined4 in_register_00000084;
  uint *puVar26;
  ulong uVar27;
  ulong unaff_R12;
  ulong unaff_R13;
  uint uVar28;
  InstNode *pIVar29;
  bool bVar30;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  ulong uStack_b8;
  ulong uStack_b0;
  ulong uStack_a8;
  RALocalAllocator *pRStack_a0;
  InstNode *pIStack_98;
  long lStack_90;
  Error EStack_84;
  ulong uStack_80;
  RALocalAllocator *pRStack_78;
  InstNode *pIStack_70;
  BaseNode *pBStack_68;
  ulong uStack_60;
  ulong uStack_58;
  
  puVar26 = (uint *)CONCAT44(in_register_00000084,allocableRegs);
  pBVar24 = (BaseNode *)CONCAT71(in_register_00000031,group);
  if (allocableRegs == 0) {
    decideOnReassignment();
LAB_00124ef1:
    workId = physId;
    decideOnReassignment();
  }
  else {
    physId = physId;
    if (*(uint *)&this->_pass->field_0x148 <= workId) goto LAB_00124ef1;
    lVar23 = *(long *)(*(long *)&this->_pass->_workRegs + (ulong)workId * 8);
    bVar3 = *(byte *)(lVar23 + 0x4a);
    if ((bVar3 != 0xff) && ((allocableRegs >> (bVar3 & 0x1f) & 1) != 0)) {
      return (uint)bVar3;
    }
    if (group < kPC) {
      uVar17 = (uint)group;
      uVar21 = (ulong)*(byte *)((long)(raInst->_liveCount).n._data + ((ulong)group - 4));
      if (uVar21 != 0) {
        puVar25 = (uint32_t *)
                  ((long)&raInst->_tiedRegs[0]._workId +
                  (ulong)(((raInst->_tiedIndex).super_RARegCount.field_0._packed >>
                           (group * '\b' & 0x1f) & 0xff) << 5));
        do {
          if (*puVar25 == workId) goto LAB_00124eab;
          puVar25 = puVar25 + 8;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
      }
      puVar25 = (uint32_t *)0x0;
LAB_00124eab:
      if ((puVar25 != (uint32_t *)0x0) && ((puVar25[2] & 0x40008) != 0)) {
        uVar9 = 0;
        if (allocableRegs == 0) {
          return 0;
        }
        for (; (allocableRegs >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
        }
        return uVar9;
      }
      if ((*(byte *)(lVar23 + 0x24) & 4) == 0) {
        uVar20 = ~*(uint *)(lVar23 + 0x38) & allocableRegs;
        if (uVar20 != 0) {
          uVar16 = ~(this->_funcPreservedRegs)._masks._data[group] & uVar20;
          if (uVar16 == 0) {
            uVar16 = uVar20;
          }
          uVar17 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
        }
        if (uVar20 != 0) {
          return uVar17;
        }
      }
      return 0xff;
    }
  }
  decideOnReassignment();
  if (workId == 0) {
LAB_00124fda:
    decideOnSpillFor();
  }
  else if ((byte)pBVar24 < 4) {
    uVar17 = 0;
    if (workId != 0) {
      for (; (workId >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
      }
    }
    uVar27 = (ulong)pBVar24 & 0xff;
    pBVar24 = (BaseNode *)(this->_curAssignment)._physToWorkIds._data[uVar27];
    uVar20 = *(uint *)(pBVar24 + (ulong)uVar17 * 4);
    uVar21 = (ulong)uVar20;
    uVar16 = workId - 1 & workId;
    if (uVar16 == 0) {
LAB_00124fc9:
      *puVar26 = uVar20;
      return uVar17;
    }
    uVar4 = *(uint *)&this->_pass->field_0x148;
    if (uVar20 < uVar4) {
      lVar23 = *(long *)&this->_pass->_workRegs;
      uVar22 = (uint)(*(float *)(*(long *)(lVar23 + uVar21 * 8) + 100) * 1048576.0);
      uVar5 = (((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[uVar27];
      this = (RALocalAllocator *)(ulong)uVar5;
      uVar20 = uVar22 + 0x40000;
      if ((uVar5 >> (uVar17 & 0x1f) & 1) == 0) {
        uVar20 = uVar22;
      }
      uVar27 = (ulong)uVar20;
      do {
        uVar22 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        unaff_RBX = (ulong)uVar22;
        uVar20 = *(uint *)(pBVar24 + unaff_RBX * 4);
        if (uVar4 <= uVar20) {
          decideOnSpillFor();
          goto LAB_00124fda;
        }
        uVar28 = (uint)(*(float *)(*(long *)(lVar23 + (ulong)uVar20 * 8) + 100) * 1048576.0);
        uVar14 = uVar28 + 0x40000;
        if ((uVar5 >> (uVar22 & 0x1f) & 1) == 0) {
          uVar14 = uVar28;
        }
        unaff_R12 = (ulong)uVar14;
        bVar30 = uVar14 < (uint)uVar27;
        if (bVar30) {
          uVar21 = (ulong)uVar20;
          uVar27 = unaff_R12;
        }
        uVar20 = (uint)uVar21;
        if (bVar30) {
          uVar17 = uVar22;
        }
        uVar16 = uVar16 - 1 & uVar16;
      } while (uVar16 != 0);
      goto LAB_00124fc9;
    }
    goto LAB_00124fe4;
  }
  decideOnSpillFor();
LAB_00124fe4:
  decideOnSpillFor();
  uVar21 = *(ulong *)(pBVar24 + 0x20);
  node = (InstNode *)(ulong)*(uint *)(uVar21 + 0x10);
  if (node != (InstNode *)0x0) {
    pRStack_78 = (RALocalAllocator *)&this->_curAssignment;
    lVar23 = uVar21 + 0x54;
    pIVar29 = (InstNode *)0x0;
    this_00 = this;
    pIStack_70 = node;
    pBStack_68 = pBVar24;
    uStack_60 = unaff_RBX;
    uStack_58 = unaff_R12;
    do {
      if ((InstNode *)(ulong)*(uint *)(uVar21 + 0x10) <= pIVar29) {
        lStack_90 = 0x125140;
        spillAfterAllocation();
LAB_00125140:
        lStack_90 = 0x125145;
        spillAfterAllocation();
LAB_00125145:
        lStack_90 = 0x12514a;
        spillAfterAllocation();
LAB_0012514a:
        lStack_90 = 0x12514f;
        spillAfterAllocation();
LAB_0012514f:
        lStack_90 = 0x125154;
        spillAfterAllocation();
LAB_00125154:
        lStack_90 = 0x125159;
        spillAfterAllocation();
        (this_00->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node;
        uStack_b8 = uVar21;
        uStack_b0 = unaff_R12;
        uStack_a8 = unaff_R13;
        pRStack_a0 = this;
        pIStack_98 = pIVar29;
        lStack_90 = lVar23;
        if (*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) {
          EVar18 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true);
          uVar21 = (ulong)EVar18;
          if (EVar18 != 0) {
            return EVar18;
          }
        }
        EVar18 = allocInst(this_00,node);
        if (EVar18 != 0) {
          return EVar18;
        }
        uVar17 = *(uint *)(block + 0xb8);
        if ((ulong)uVar17 == 0xffffffff) {
          pRVar19 = block + 0xbc;
LAB_001251fe:
          EVar18 = spillScratchGpRegsBeforeEntry(this_00,*(RegMask *)pRVar19);
          if (EVar18 != 0) {
            return EVar18;
          }
          if (*(long *)(block + 200) == 0) {
            EVar18 = BaseRAPass::setBlockEntryAssignment
                               (this_00->_pass,block,this_00->_block,&this_00->_curAssignment);
            if (EVar18 != 0) {
              return EVar18;
            }
            goto LAB_001253c0;
          }
          pBVar24 = *(BaseNode **)this_00->_pass->_extraBlock;
          pRVar19 = (RABlock *)BaseBuilder::setCursor(&this_00->_cc->super_BaseBuilder,pBVar24);
          pWVar7 = (this_00->_curAssignment)._workToPhysMap;
          memcpy((this_00->_tmpAssignment)._physToWorkMap,(this_00->_curAssignment)._physToWorkMap,
                 (ulong)(this_00->_tmpAssignment)._layout.physTotal * 4 + 0x20);
          memcpy((this_00->_tmpAssignment)._workToPhysMap,pWVar7,
                 (ulong)(this_00->_tmpAssignment)._layout.workCount);
          bVar30 = false;
          EVar18 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
          if (EVar18 != 0) goto LAB_001253bb;
          EVar18 = (Error)uVar21;
          if ((this_00->_cc->super_BaseBuilder)._cursor != pBVar24) {
            if ((uint)(byte)node[0x13] <= (byte)node[0x12] - 1) goto LAB_001253d8;
            lVar23 = (ulong)((byte)node[0x12] - 1) * 0x10;
            if ((*(uint *)(node + lVar23 + 0x40) & 7) != 5) goto LAB_001253dd;
            (*(this_00->_cc->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_e0);
            uStack_d0 = *(undefined8 *)(node + lVar23 + 0x40);
            uStack_c8 = *(undefined8 *)(node + lVar23 + 0x48);
            *(undefined4 *)(node + lVar23 + 0x40) = uStack_e0;
            *(undefined4 *)(node + lVar23 + 0x44) = uStack_dc;
            *(undefined4 *)(node + lVar23 + 0x48) = uStack_d8;
            *(undefined4 *)(node + lVar23 + 0x4c) = uStack_d4;
            node[0x34] = (InstNode)((byte)node[0x34] & 0xef);
            EVar18 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
            bVar30 = EVar18 == 0;
            if (bVar30) {
              pBVar8 = this_00->_cc;
              (pBVar8->super_BaseBuilder)._cursor = pBVar24;
              (*(pBVar8->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar8,&uStack_e0);
              EVar18 = (Error)uVar21;
            }
            goto LAB_00125340;
          }
        }
        else {
          if (uVar17 < *(uint *)(*(long *)block + 0xf0)) {
            pRVar19 = (RABlock *)((ulong)uVar17 * 0x20 + *(long *)(*(long *)block + 0xe8));
            goto LAB_001251fe;
          }
          allocBranch();
          pRVar19 = block;
LAB_001253d8:
          allocBranch();
LAB_001253dd:
          EVar18 = 3;
          bVar30 = false;
LAB_00125340:
          if (!bVar30) {
            bVar30 = false;
            goto LAB_001253bb;
          }
        }
        (this_00->_cc->super_BaseBuilder)._cursor = (BaseNode *)pRVar19;
        pWVar7 = (this_00->_curAssignment)._workToPhysMap;
        pPVar10 = (this_00->_curAssignment)._physToWorkMap;
        pPVar11 = (this_00->_tmpAssignment)._physToWorkMap;
        (this_00->_curAssignment)._workToPhysMap = (this_00->_tmpAssignment)._workToPhysMap;
        (this_00->_curAssignment)._physToWorkMap = pPVar11;
        (this_00->_tmpAssignment)._workToPhysMap = pWVar7;
        (this_00->_tmpAssignment)._physToWorkMap = pPVar10;
        lVar23 = 0;
        do {
          ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar23;
          puVar26 = *ppuVar1;
          puVar12 = ppuVar1[1];
          ppuVar2 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar23;
          puVar13 = ppuVar2[1];
          ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar23;
          *ppuVar1 = *ppuVar2;
          ppuVar1[1] = puVar13;
          ppuVar1 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar23;
          *ppuVar1 = puVar26;
          ppuVar1[1] = puVar12;
          lVar23 = lVar23 + 2;
        } while (lVar23 != 4);
        bVar30 = true;
LAB_001253bb:
        if (bVar30) {
LAB_001253c0:
          EVar18 = 0;
        }
        return EVar18;
      }
      bVar30 = true;
      if ((*(byte *)(lVar23 + 2) & 2) != 0) {
        uVar17 = *(uint *)(lVar23 + -8);
        unaff_R12 = (ulong)uVar17;
        if (*(uint *)&this->_pass->field_0x148 <= uVar17) goto LAB_00125140;
        lVar6 = *(long *)(*(long *)&this->_pass->_workRegs + unaff_R12 * 8);
        if (*(char *)(lVar6 + 0x4a) != -1) goto LAB_00125110;
        if (uVar17 == 0xffffffff) goto LAB_00125145;
        if ((this->_curAssignment)._layout.workCount <= uVar17) goto LAB_0012514a;
        bVar3 = (this->_curAssignment)._workToPhysMap[unaff_R12].physIds[0];
        unaff_R13 = (ulong)bVar3;
        if (bVar3 == 0xff) goto LAB_00125110;
        RVar15 = *(RegGroup *)(lVar6 + 0x21);
        (this->_cc->super_BaseBuilder)._cursor = pBStack_68;
        if (0x1f < bVar3) goto LAB_0012514f;
        RVar15 = RVar15 & kMaxValue;
        if (kExtraVirt3 < RVar15) goto LAB_00125154;
        if (((((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[RVar15] >> (bVar3 & 0x1f)
            & 1) == 0) {
LAB_001250e9:
          lStack_90 = 0x1250f9;
          this_00 = pRStack_78;
          RAAssignment::unassign((RAAssignment *)pRStack_78,RVar15,uVar17,(uint)bVar3);
          EVar18 = 0;
        }
        else {
          lStack_90 = 0x1250e0;
          this_00 = this;
          uStack_80 = (ulong)RVar15;
          EVar18 = onSaveReg(this,RVar15,uVar17,(uint)bVar3);
          RVar15 = (RegGroup)uStack_80;
          if (EVar18 == 0) goto LAB_001250e9;
        }
        bVar30 = EVar18 == 0;
        node = pIStack_70;
        if (!bVar30) {
          EStack_84 = EVar18;
        }
      }
LAB_00125110:
      if (!bVar30) {
        return EStack_84;
      }
      pIVar29 = pIVar29 + 1;
      lVar23 = lVar23 + 0x20;
    } while (node != pIVar29);
  }
  return 0;
}

Assistant:

uint32_t RALocalAllocator::decideOnReassignment(RegGroup group, uint32_t workId, uint32_t physId, RegMask allocableRegs, RAInst* raInst) const noexcept {
  ASMJIT_ASSERT(allocableRegs != 0);
  DebugUtils::unused(physId);

  RAWorkReg* workReg = workRegById(workId);

  // Prefer reassignment back to HomeId, if possible.
  if (workReg->hasHomeRegId()) {
    if (Support::bitTest(allocableRegs, workReg->homeRegId())) {
      return workReg->homeRegId();
    }
  }

  // Prefer assignment to a temporary register in case this register is killed by the instruction (or has an out slot).
  const RATiedReg* tiedReg = raInst->tiedRegForWorkReg(group, workId);
  if (tiedReg && tiedReg->isOutOrKill()) {
    return Support::ctz(allocableRegs);
  }

  // Prefer reassignment if this register is only used within a single basic block.
  if (workReg->isWithinSingleBasicBlock()) {
    RegMask filteredRegs = allocableRegs & ~workReg->clobberSurvivalMask();
    if (filteredRegs) {
      return pickBestSuitableRegister(group, filteredRegs);
    }
  }

  // TODO: [Register Allocator] This could be improved.

  // Decided to SPILL.
  return RAAssignment::kPhysNone;
}